

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMappingValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)606>(Result *__return_storage_ptr__,Model *format)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  uint32 uVar1;
  bool bVar2;
  CategoricalMapping *pCVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  SequenceFeatureType *pSVar6;
  char *pcVar7;
  MLFeatureTypeType unaff_EBP;
  ModelDescription *from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  MLFeatureTypeType x;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_139;
  undefined1 local_138 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Result result;
  ModelDescription interface;
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription(&interface,from);
  Result::Result(&result);
  validateModelDescription((Result *)local_138,&interface,format->specificationversion_);
  Result::operator=(&result,(Result *)local_138);
  std::__cxx11::string::~string((string *)(local_138 + 8));
  bVar2 = Result::good(&result);
  if (bVar2) {
    pCVar3 = Specification::Model::categoricalmapping(format);
    uVar1 = pCVar3->_oneof_case_[0];
    pCVar3 = Specification::Model::categoricalmapping(format);
    if (uVar1 == 0) {
      std::__cxx11::string::string((string *)local_138,"Mapping not set.",(allocator *)&local_110);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
LAB_00557a70:
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
LAB_00557a75:
      std::__cxx11::string::~string((string *)this_01);
      goto LAB_00557c18;
    }
    if (uVar1 == 1) {
      if (pCVar3->_oneof_case_[1] == 0x65) {
        std::__cxx11::string::string
                  ((string *)local_138,
                   "ValueOnUnknown set to string value while mapping produces int64.",
                   (allocator *)&local_110);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
        goto LAB_00557a70;
      }
      format = (Model *)0x3;
      unaff_EBP = MLFeatureTypeType_int64Type;
    }
    else if (uVar1 == 2) {
      if (pCVar3->_oneof_case_[1] == 0x66) {
        std::__cxx11::string::string
                  ((string *)local_138,
                   "ValueOnUnknown set to Int64 value while mapping produces string.",
                   (allocator *)&local_110);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
        goto LAB_00557a70;
      }
      unaff_EBP = MLFeatureTypeType_stringType;
      format = (Model *)0x1;
    }
    x = (MLFeatureTypeType)format;
    local_f0._M_dataplus._M_p._4_4_ = 7;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_f0;
    local_f0._M_dataplus._M_p._0_4_ = x;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_110,__l,&local_139);
    this = &interface.input_;
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_138,(CoreML *)this,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_110,
               in_R8);
    Result::operator=(&result,(Result *)local_138);
    std::__cxx11::string::~string((string *)(local_138 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_110);
    bVar2 = Result::good(&result);
    if (bVar2) {
      local_f0._M_dataplus._M_p._4_4_ = 7;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_f0;
      local_f0._M_dataplus._M_p._0_4_ = unaff_EBP;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_110,__l_00,&local_139);
      this_00 = &interface.output_;
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_138,(CoreML *)this_00,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_110,
                 in_R8);
      Result::operator=(&result,(Result *)local_138);
      std::__cxx11::string::~string((string *)(local_138 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_110);
      bVar2 = Result::good(&result);
      if (bVar2) {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,0);
        pFVar5 = pTVar4->type_;
        if (pFVar5 == (FeatureType *)0x0) {
          pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar5->_oneof_case_[0] == 7) {
          pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,0);
          pFVar5 = pTVar4->type_;
          if (pFVar5 == (FeatureType *)0x0) {
            pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          pSVar6 = Specification::FeatureType::sequencetype(pFVar5);
          if (pSVar6->_oneof_case_[0] == x) {
            pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (&this_00->super_RepeatedPtrFieldBase,0);
            pFVar5 = pTVar4->type_;
            if (pFVar5 == (FeatureType *)0x0) {
              pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar5->_oneof_case_[0] != 7) {
              std::__cxx11::string::string
                        ((string *)local_138,
                         "Output of a sequence categorical mapping must be a sequence",
                         (allocator *)&local_110);
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             (string *)local_138);
              goto LAB_00557a70;
            }
            pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (&this_00->super_RepeatedPtrFieldBase,0);
            pFVar5 = pTVar4->type_;
            if (pFVar5 == (FeatureType *)0x0) {
              pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            pSVar6 = Specification::FeatureType::sequencetype(pFVar5);
            if (pSVar6->_oneof_case_[0] == unaff_EBP) goto LAB_00557c0b;
            std::__cxx11::string::string
                      ((string *)&local_f0,"Output sequence type does not match input type ",
                       (allocator *)&local_139);
            pcVar7 = ::MLFeatureTypeType_Name(unaff_EBP);
            std::operator+(&local_110,&local_f0,pcVar7);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_110,"of categorical mapping.");
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)local_138);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_f0,"Input sequence type does not match input type ",
                       (allocator *)&local_139);
            pcVar7 = ::MLFeatureTypeType_Name(x);
            std::operator+(&local_110,&local_f0,pcVar7);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_110,"of categorical mapping.");
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)local_138);
          }
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)&local_110);
          this_01 = &local_f0;
          goto LAB_00557a75;
        }
      }
    }
  }
LAB_00557c0b:
  Result::Result(__return_storage_ptr__,&result);
LAB_00557c18:
  std::__cxx11::string::~string((string *)&result.m_message);
  Specification::ModelDescription::~ModelDescription(&interface);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_categoricalMapping>(const Specification::Model& format) {
        auto interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        auto mapping_type = format.categoricalmapping().MappingType_case();
        auto defval_type = format.categoricalmapping().ValueOnUnknown_case();
        Specification::FeatureType::TypeCase requiredInputType;
        Specification::FeatureType::TypeCase requiredOutputType;
        Specification::SequenceFeatureType::TypeCase requiredInputSeqType;
        Specification::SequenceFeatureType::TypeCase requiredOutputSeqType;

        switch(mapping_type) {
            case Specification::CategoricalMapping::MappingTypeCase::kStringToInt64Map:
                
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kStrValue) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to string value while mapping produces int64.");
                }
                requiredInputType = Specification::FeatureType::kStringType;
                requiredOutputType = Specification::FeatureType::kInt64Type;
                requiredInputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredOutputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::kInt64ToStringMap:
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kInt64Value) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to Int64 value while mapping produces string.");
                }
                requiredOutputType = Specification::FeatureType::kStringType;
                requiredInputType = Specification::FeatureType::kInt64Type;
                requiredOutputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredInputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::MAPPINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Mapping not set.");
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {requiredInputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {requiredOutputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }

        // Check if the input was a sequence
        if (interface.input(0).type().Type_case() == Specification::FeatureType::kSequenceType) {

            // Make sure its the correct input type
            if (interface.input(0).type().sequencetype().Type_case() != requiredInputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Input sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredInputType)) +
                              "of categorical mapping.");
            }

            // Make sure the outupt is a sequence as well
            if (interface.output(0).type().Type_case() != Specification::FeatureType::kSequenceType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              "Output of a sequence categorical mapping must be a sequence");
            }

            // Make sure the otuput is the correct type
            if (interface.output(0).type().sequencetype().Type_case() != requiredOutputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Output sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredOutputType)) +
                              "of categorical mapping.");
            }
        }


        // Validate the parameters
        return result;
    }